

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O0

void __thiscall
CryptoUtil_DecryptAes256CbcToStringKeyEmpty_Test::~CryptoUtil_DecryptAes256CbcToStringKeyEmpty_Test
          (CryptoUtil_DecryptAes256CbcToStringKeyEmpty_Test *this)

{
  CryptoUtil_DecryptAes256CbcToStringKeyEmpty_Test *this_local;
  
  ~CryptoUtil_DecryptAes256CbcToStringKeyEmpty_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CryptoUtil, DecryptAes256CbcToStringKeyEmpty) {
  try {
    std::vector<uint8_t> key;
    ByteData iv("33343536373839303132333435363738");
    ByteData data(
        "2ef199bb7d160f94fc17fa5f01b220c630d6b19a5973f4b313868c921fc10d22");
    std::string result = CryptoUtil::DecryptAes256CbcToString(key,
                                                              iv.GetBytes(),
                                                              data);
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "DecryptAes256Cbc key size error.");
    return;
  }
  ASSERT_TRUE(false);
}